

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.c
# Opt level: O2

ErrorNumber allocLib(void)

{
  TA_RetCode TVar1;
  ErrorNumber EVar2;
  
  TVar1 = TA_Initialize();
  if (TVar1 == TA_SUCCESS) {
    EVar2 = TA_TEST_PASS;
  }
  else {
    printf("TA_Initialize failed [%d]\n",(ulong)TVar1);
    EVar2 = TA_TESTUTIL_INIT_FAILED;
  }
  return EVar2;
}

Assistant:

ErrorNumber allocLib()
{
   TA_RetCode retCode;

   /* Initialize the library. */
   retCode = TA_Initialize();
   if( retCode != TA_SUCCESS )
   {
      printf( "TA_Initialize failed [%d]\n", retCode );
      return TA_TESTUTIL_INIT_FAILED;
   }

   return TA_TEST_PASS;
}